

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

int memcmp(void *__s1,void *__s2,size_t __n)

{
  int iVar1;
  size_t sVar2;
  
  if (__n != 0) {
    sVar2 = 0;
    do {
      iVar1 = (uint)*(byte *)((long)__s1 + sVar2) - (uint)*(byte *)((long)__s2 + sVar2);
      if (iVar1 != 0) {
        return iVar1;
      }
      sVar2 = sVar2 + 1;
    } while (__n != sVar2);
  }
  return 0;
}

Assistant:

int memcmp(const void *lhs, const void *rhs, size_t count) {
    const unsigned char *lhs_ = lhs;
    const unsigned char *rhs_ = rhs;

    for (size_t i = 0; i < count; ++i) {
        const int res = lhs_[i] - rhs_[i];
        if (res != 0) {
            return res;
        }
    }

    return 0;
}